

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int stbtt__close_shape(stbtt_vertex *vertices,int num_vertices,int was_off,int start_off,
                      stbtt_int32 sx,stbtt_int32 sy,stbtt_int32 scx,stbtt_int32 scy,stbtt_int32 cx,
                      stbtt_int32 cy)

{
  stbtt_vertex *psVar1;
  long lVar2;
  short sVar3;
  short sVar4;
  
  sVar3 = (short)sx;
  sVar4 = (short)sy;
  if (start_off == 0) {
    lVar2 = (long)num_vertices;
    psVar1 = vertices + lVar2;
    if (was_off == 0) {
      psVar1->type = '\x02';
      psVar1->x = sVar3;
      psVar1->y = sVar4;
      psVar1->cx = 0;
      scy = 0;
    }
    else {
      psVar1->type = '\x03';
      psVar1->x = sVar3;
      psVar1->y = sVar4;
      psVar1->cx = (short)cx;
      scy = cy;
    }
  }
  else {
    if (was_off != 0) {
      vertices[num_vertices].type = '\x03';
      vertices[num_vertices].x = (short)((uint)(cx + scx) >> 1);
      vertices[num_vertices].y = (short)((uint)(cy + scy) >> 1);
      vertices[num_vertices].cx = (short)cx;
      vertices[num_vertices].cy = (short)cy;
      num_vertices = num_vertices + 1;
    }
    lVar2 = (long)num_vertices;
    vertices[lVar2].type = '\x03';
    vertices[lVar2].x = sVar3;
    vertices[lVar2].y = sVar4;
    vertices[lVar2].cx = (short)scx;
  }
  vertices[lVar2].cy = (short)scy;
  return num_vertices + 1;
}

Assistant:

static int stbtt__close_shape(stbtt_vertex *vertices, int num_vertices, int was_off, int start_off,
stbtt_int32 sx, stbtt_int32 sy, stbtt_int32 scx, stbtt_int32 scy, stbtt_int32 cx, stbtt_int32 cy)
{
if (start_off) {
if (was_off)
stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, (cx+scx)>>1, (cy+scy)>>1, cx,cy);
stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, sx,sy,scx,scy);
} else {
if (was_off)
stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve,sx,sy,cx,cy);
else
stbtt_setvertex(&vertices[num_vertices++], STBTT_vline,sx,sy,0,0);
}
return num_vertices;
}